

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O0

int npf_parse_format_spec(char *format,npf_format_spec_t *out_spec)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  uint8_t local_29;
  char *pcStack_28;
  uint_fast8_t tmp_conv;
  char *cur;
  npf_format_spec_t *out_spec_local;
  char *format_local;
  
  out_spec->left_justified = '\0';
  out_spec->leading_zero_pad = '\0';
  out_spec->case_adjust = ' ';
  out_spec->prepend = '\0';
  out_spec->alt_form = '\0';
  pcStack_28 = format;
  while (pcVar3 = pcStack_28 + 1, pcStack_28[1] != '\0') {
    switch(*pcVar3) {
    case ' ':
      pcStack_28 = pcVar3;
      if (out_spec->prepend == '\0') {
        out_spec->prepend = ' ';
      }
      break;
    default:
      goto LAB_00106ccf;
    case '#':
      out_spec->alt_form = '#';
      pcStack_28 = pcVar3;
      break;
    case '+':
      out_spec->prepend = '+';
      pcStack_28 = pcVar3;
      break;
    case '-':
      out_spec->left_justified = '-';
      out_spec->leading_zero_pad = '\0';
      pcStack_28 = pcVar3;
      break;
    case '0':
      out_spec->leading_zero_pad = (out_spec->left_justified != '\0' ^ 0xffU) & 1;
      pcStack_28 = pcVar3;
    }
  }
LAB_00106ccf:
  out_spec->field_width = 0;
  out_spec->field_width_opt = '\0';
  if (*pcVar3 == '*') {
    out_spec->field_width_opt = '\x02';
    pcStack_28 = pcStack_28 + 2;
  }
  else {
    while( true ) {
      pcStack_28 = pcVar3;
      bVar1 = false;
      if ('/' < *pcStack_28) {
        bVar1 = *pcStack_28 < ':';
      }
      if (!bVar1) break;
      out_spec->field_width_opt = '\x01';
      out_spec->field_width = out_spec->field_width * 10 + *pcStack_28 + -0x30;
      pcVar3 = pcStack_28 + 1;
    }
  }
  out_spec->prec = 0;
  out_spec->prec_opt = '\0';
  if (*pcStack_28 == '.') {
    pcVar3 = pcStack_28 + 1;
    if (*pcVar3 == '*') {
      out_spec->prec_opt = '\x02';
      pcStack_28 = pcStack_28 + 2;
    }
    else {
      if (*pcVar3 == '-') {
        pcStack_28 = pcStack_28 + 2;
      }
      else {
        out_spec->prec_opt = '\x01';
        pcStack_28 = pcVar3;
      }
      while( true ) {
        bVar1 = false;
        if ('/' < *pcStack_28) {
          bVar1 = *pcStack_28 < ':';
        }
        if (!bVar1) break;
        out_spec->prec = out_spec->prec * 10 + *pcStack_28 + -0x30;
        pcStack_28 = pcStack_28 + 1;
      }
    }
  }
  local_29 = '\0';
  out_spec->length_modifier = '\0';
  pcVar3 = pcStack_28 + 1;
  if (*pcStack_28 == 'h') {
    out_spec->length_modifier = '\x01';
    pcVar2 = pcVar3;
    if (*pcVar3 == 'h') {
      out_spec->length_modifier = '\x03';
      pcVar2 = pcStack_28 + 2;
    }
  }
  else {
    pcVar2 = pcStack_28;
    if (*pcStack_28 == 'l') {
      out_spec->length_modifier = '\x04';
      pcVar2 = pcVar3;
    }
  }
  pcStack_28 = pcVar2;
  switch(*pcStack_28) {
  case '%':
    out_spec->conv_spec = '\x01';
    out_spec->prec_opt = '\0';
    break;
  default:
    return 0;
  case 'B':
    out_spec->case_adjust = '\0';
  case 'b':
    out_spec->conv_spec = '\x05';
    break;
  case 'c':
    out_spec->conv_spec = '\x02';
    out_spec->prec_opt = '\0';
    break;
  case 'd':
  case 'i':
    local_29 = '\x04';
  case 'o':
    if (local_29 == '\0') {
      local_29 = '\x06';
    }
  case 'u':
    if (local_29 == '\0') {
      local_29 = '\b';
    }
  case 'X':
    if (local_29 == '\0') {
      out_spec->case_adjust = '\0';
    }
  case 'x':
    if (local_29 == '\0') {
      local_29 = '\a';
    }
    out_spec->conv_spec = local_29;
    if (out_spec->prec_opt != '\0') {
      out_spec->leading_zero_pad = '\0';
    }
    break;
  case 'p':
    out_spec->conv_spec = '\t';
    out_spec->prec_opt = '\0';
    break;
  case 's':
    out_spec->conv_spec = '\x03';
    out_spec->leading_zero_pad = '\0';
  }
  return ((int)pcStack_28 + 1) - (int)format;
}

Assistant:

static int npf_parse_format_spec(char const *format, npf_format_spec_t *out_spec) {
  char const *cur = format;

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
  out_spec->left_justified = 0;
  out_spec->leading_zero_pad = 0;
#endif
  out_spec->case_adjust = 'a' - 'A'; // lowercase
  out_spec->prepend = 0;
  out_spec->alt_form = 0;

  while (*++cur) { // cur points at the leading '%' character
    switch (*cur) { // Optional flags
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
      case '-': out_spec->left_justified = '-'; out_spec->leading_zero_pad = 0; continue;
      case '0': out_spec->leading_zero_pad = !out_spec->left_justified; continue;
#endif
      case '+': out_spec->prepend = '+'; continue;
      case ' ': if (out_spec->prepend == 0) { out_spec->prepend = ' '; } continue;
      case '#': out_spec->alt_form = '#'; continue;
      default: break;
    }
    break;
  }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
  out_spec->field_width = 0;
  out_spec->field_width_opt = NPF_FMT_SPEC_OPT_NONE;
  if (*cur == '*') {
    out_spec->field_width_opt = NPF_FMT_SPEC_OPT_STAR;
    ++cur;
  } else {
    while ((*cur >= '0') && (*cur <= '9')) {
      out_spec->field_width_opt = NPF_FMT_SPEC_OPT_LITERAL;
      out_spec->field_width = (out_spec->field_width * 10) + (*cur++ - '0');
    }
  }
#endif

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
  out_spec->prec = 0;
  out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
  if (*cur == '.') {
    ++cur;
    if (*cur == '*') {
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_STAR;
      ++cur;
    } else {
      if (*cur == '-') {
        ++cur;
      } else {
        out_spec->prec_opt = NPF_FMT_SPEC_OPT_LITERAL;
      }
      while ((*cur >= '0') && (*cur <= '9')) {
        out_spec->prec = (out_spec->prec * 10) + (*cur++ - '0');
      }
    }
  }
#endif

  uint_fast8_t tmp_conv = NPF_FMT_SPEC_CONV_NONE;
  out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_NONE;
  switch (*cur++) { // Length modifier
    case 'h':
      out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_SHORT;
      if (*cur == 'h') {
        out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_CHAR;
        ++cur;
      }
      break;
    case 'l':
      out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LONG;
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
      if (*cur == 'l') {
        out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_LONG_LONG;
        ++cur;
      }
#endif
      break;
#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
    case 'L': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LONG_DOUBLE; break;
#endif
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
    case 'j': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_INTMAX; break;
    case 'z': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_SIZET; break;
    case 't': out_spec->length_modifier = NPF_FMT_SPEC_LEN_MOD_LARGE_PTRDIFFT; break;
#endif
    default: --cur; break;
  }

  switch (*cur++) { // Conversion specifier
    case '%': out_spec->conv_spec = NPF_FMT_SPEC_CONV_PERCENT;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

    case 'c': out_spec->conv_spec = NPF_FMT_SPEC_CONV_CHAR;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

    case 's': out_spec->conv_spec = NPF_FMT_SPEC_CONV_STRING;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
      out_spec->leading_zero_pad = 0;
#endif
      break;

    case 'i':
    case 'd': tmp_conv = NPF_FMT_SPEC_CONV_SIGNED_INT;
    case 'o':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_OCTAL; }
    case 'u':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_UNSIGNED_INT; }
    case 'X':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { out_spec->case_adjust = 0; }
    case 'x':
      if (tmp_conv == NPF_FMT_SPEC_CONV_NONE) { tmp_conv = NPF_FMT_SPEC_CONV_HEX_INT; }
      out_spec->conv_spec = (uint8_t)tmp_conv;
#if (NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1) && \
    (NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1)
      if (out_spec->prec_opt != NPF_FMT_SPEC_OPT_NONE) { out_spec->leading_zero_pad = 0; }
#endif
      break;

#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
    case 'F': out_spec->case_adjust = 0;
    case 'f':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_DEC;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'E': out_spec->case_adjust = 0;
    case 'e':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_SCI;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'G': out_spec->case_adjust = 0;
    case 'g':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_SHORTEST;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;

    case 'A': out_spec->case_adjust = 0;
    case 'a':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_FLOAT_HEX;
      if (out_spec->prec_opt == NPF_FMT_SPEC_OPT_NONE) { out_spec->prec = 6; }
      break;
#endif

#if NANOPRINTF_USE_WRITEBACK_FORMAT_SPECIFIERS == 1
    case 'n':
      // todo: reject string if flags or width or precision exist
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_WRITEBACK;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;
#endif

    case 'p':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_POINTER;
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      out_spec->prec_opt = NPF_FMT_SPEC_OPT_NONE;
#endif
      break;

#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
    case 'B':
      out_spec->case_adjust = 0;
    case 'b':
      out_spec->conv_spec = NPF_FMT_SPEC_CONV_BINARY;
      break;
#endif

    default: return 0;
  }

  return (int)(cur - format);
}